

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O0

void __thiscall bloaty::RollupOutput::~RollupOutput(RollupOutput *this)

{
  RollupRow *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  std::__cxx11::string::~string((string *)(in_RDI[1].name.field_2._M_local_buf + 8));
  RollupRow::~RollupRow(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}